

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::popStackFrame(VirtualMachine *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  string local_50;
  element_type *local_30;
  shared_ptr<runtime::StackFrame> outer;
  
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (peVar1 == (element_type *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"No current stack frame found!","");
    panic(this,&local_50);
  }
  local_30 = (peVar1->outer).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (peVar1->outer).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&((outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->locals).
                    super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&((outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&((outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->locals).
                    super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  if (local_30 != (element_type *)0x0) {
    (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_30;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->stackFrame).
                super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&outer);
    if (outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"No outer stack frame found!","");
  panic(this,&local_50);
}

Assistant:

void runtime::VirtualMachine::popStackFrame() {
  auto currentFrame = this->stackFrame;

  if (currentFrame == nullptr) {
    this->panic("No current stack frame found!");
    return;
  }

  auto outer = currentFrame->outer;

  if (outer == nullptr) {
    this->panic("No outer stack frame found!");
    return;
  }

  this->stackFrame = outer;
}